

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

int hash_iter_keys(HashTable *table,void **_key,void **iter)

{
  uint uVar1;
  undefined8 *puVar2;
  uint32 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  void *pvVar8;
  HashItem *pHVar9;
  
  puVar2 = (undefined8 *)*iter;
  uVar7 = 0;
  if (puVar2 == (undefined8 *)0x0) {
    pHVar9 = (HashItem *)0x0;
  }
  else {
    pHVar9 = (HashItem *)puVar2[2];
    if (pHVar9 == (HashItem *)0x0) {
      uVar3 = (*table->hash)((void *)*puVar2,table->data);
      uVar7 = (ulong)((table->table_len - 1 & uVar3) + 1);
    }
  }
  uVar6 = (uint)uVar7;
  if (pHVar9 == (HashItem *)0x0) {
    uVar1 = table->table_len;
    uVar5 = uVar1;
    if (uVar6 >= uVar1 && uVar6 != uVar1) {
      uVar5 = uVar6;
    }
    if (uVar6 < uVar1) {
      do {
        pHVar9 = table->table[uVar7];
        if (pHVar9 != (HashItem *)0x0) goto LAB_0011fc01;
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while (uVar5 != uVar6);
    }
    pvVar8 = (void *)0x0;
    pHVar9 = (HashItem *)0x0;
    iVar4 = 0;
  }
  else {
LAB_0011fc01:
    pvVar8 = pHVar9->key;
    iVar4 = 1;
  }
  *_key = pvVar8;
  *iter = pHVar9;
  return iVar4;
}

Assistant:

int hash_iter_keys(const HashTable *table, const void **_key, void **iter)
{
    HashItem *item = (HashItem *) *iter;
    uint32 idx = 0;

    if (item != NULL)
    {
        const HashItem *orig = item;
        item = item->next;
        if (item == NULL)
            idx = calc_hash(table, orig->key) + 1;
    } // if

    while (!item && (idx < table->table_len))
        item = table->table[idx++];  // skip empty buckets...

    if (item == NULL)  // no more matches?
    {
        *_key = NULL;
        *iter = NULL;
        return 0;
    } // if

    *_key = item->key;
    *iter = item;
    return 1;
}